

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

Map<String,_String> * Process::getEnvironmentVariables(void)

{
  char *in;
  char *pcVar1;
  usize length;
  Map<String,_String> *in_RDI;
  undefined1 local_90 [8];
  String value;
  String var;
  char *x;
  char *e;
  size_t i;
  Map<String,_String> *result;
  
  Map<String,_String>::Map(in_RDI);
  for (e = (char *)0x0; *(long *)(_environ + (long)e * 8) != 0; e = e + 1) {
    in = *(char **)(_environ + (long)e * 8);
    pcVar1 = String::find(in,'=');
    if (pcVar1 != (char *)0x0) {
      String::String((String *)&value._data.ref);
      String::attach((String *)&value._data.ref,in,(long)pcVar1 - (long)in);
      String::String((String *)local_90);
      length = String::length(in + 1);
      String::attach((String *)local_90,in + 1,length);
      Map<String,_String>::insert(in_RDI,(String *)&value._data.ref,(String *)local_90);
      String::~String((String *)local_90);
      String::~String((String *)&value._data.ref);
    }
  }
  return in_RDI;
}

Assistant:

Map<String, String> Process::getEnvironmentVariables()
{
#ifdef _WIN32
  Map<String, String> result;
  LPTCH environmentStrings = GetEnvironmentStrings();
  if (!environmentStrings)
    return result;
  struct Guard
  {
    LPTCH _environmentStrings;
    ~Guard() { FreeEnvironmentStrings(_environmentStrings); }
  } guard = { environmentStrings };

  for (LPTCH i = environmentStrings; *i != '\0'; ++i)
  {
    String key;
    String value;

    for (; *i != '='; ++i)
      key += *i;
    ++i;
    for (; *i != '\0'; ++i)
        value += *i;

    if (key.isEmpty())
      continue;
    result.insert(key, value);
  }
  return result;
#else
  Map<String, String> result;
  for (size_t i = 0; environ[i]; ++i)
  {
    const char* e = environ[i];
    const char* x = String::find(e, '=');
    if (!x)
      continue;
    String var;
    var.attach(e, x - e);
    String value;
    ++e;
    value.attach(e, String::length(e));
    result.insert(var, value);
  }
  return result;
#endif
}